

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

void Function_Pool::Threshold
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t threshold)

{
  FunctionTask local_170;
  
  FunctionTask::FunctionTask(&local_170);
  FunctionTask::Threshold
            (&local_170,in,startXIn,startYIn,out,startXOut,startYOut,width,height,threshold);
  FunctionTask::~FunctionTask(&local_170);
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t threshold )
    {
        FunctionTask().Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, threshold );
    }